

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O0

Am_Drawonable * __thiscall Screen_Manager::Member(Screen_Manager *this,Display *dpy)

{
  Screen_Info *local_28;
  Screen_Info *screen;
  Display *dpy_local;
  Screen_Manager *this_local;
  
  if (this->head != (Screen_Info *)0x0) {
    local_28 = this->head;
    do {
      if (local_28->dpy == dpy) {
        return local_28->draw;
      }
      local_28 = local_28->next;
    } while (local_28 != this->head);
  }
  return (Am_Drawonable *)0x0;
}

Assistant:

Am_Drawonable *
Screen_Manager::Member(Display *dpy)
{
  if (!head)
    return nullptr;
  Screen_Info *screen = head;
  do {
    if (screen->dpy == dpy)
      return screen->draw;
    screen = screen->next;
  } while (screen != head);

  return nullptr;
}